

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

void return_free_node(lua_State *L,int pool,socket_buffer *sb)

{
  undefined8 *p;
  long lVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  long lVar3;
  
  lVar3 = CONCAT44(in_register_00000034,pool);
  p = *(undefined8 **)(lVar3 + 8);
  *(undefined4 *)(lVar3 + 4) = 0;
  lVar1 = p[2];
  *(long *)(lVar3 + 8) = lVar1;
  if (lVar1 == 0) {
    *(undefined8 *)(lVar3 + 0x10) = 0;
  }
  lua_rawgeti(L,2,1);
  pvVar2 = lua_touserdata(L,-1);
  p[2] = pvVar2;
  lua_settop(L,-2);
  free((void *)*p);
  *p = 0;
  *(undefined4 *)(p + 1) = 0;
  lua_pushlightuserdata(L,p);
  lua_rawseti(L,2,1);
  return;
}

Assistant:

static void
return_free_node(lua_State *L, int pool, struct socket_buffer *sb) {
	struct buffer_node *free_node = sb->head;
	sb->offset = 0;
	sb->head = free_node->next;
	if (sb->head == NULL) {
		sb->tail = NULL;
	}
	lua_rawgeti(L,pool,1);
	free_node->next = lua_touserdata(L,-1);
	lua_pop(L,1);
	skynet_free(free_node->msg);
	free_node->msg = NULL;

	free_node->sz = 0;
	lua_pushlightuserdata(L, free_node);
	lua_rawseti(L, pool, 1);
}